

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathNormalizeFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlChar *val;
  xmlXPathObjectPtr value;
  bool bVar1;
  xmlChar *pxStack_28;
  int blank;
  xmlChar *target;
  xmlChar *source;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    source._4_4_ = nargs;
    if (nargs == 0) {
      val = xmlXPathCastNodeToString(ctxt->context->node);
      if (val == (xmlChar *)0x0) {
        xmlXPathPErrMemory(ctxt);
      }
      value = xmlXPathCacheWrapString(ctxt,val);
      xmlXPathValuePush(ctxt,value);
      source._4_4_ = 1;
    }
    if (ctxt != (xmlXPathParserContextPtr)0x0) {
      if (source._4_4_ == 1) {
        if (ctxt->valueNr < 1) {
          xmlXPathErr(ctxt,0x17);
        }
        else {
          if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
            xmlXPathStringFunction(ctxt,1);
          }
          if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_STRING)) {
            xmlXPathErr(ctxt,0xb);
          }
          else {
            pxStack_28 = ctxt->value->stringval;
            target = pxStack_28;
            if (pxStack_28 != (xmlChar *)0x0) {
              while( true ) {
                bVar1 = true;
                if ((*target != ' ') && ((*target < 9 || (bVar1 = true, 10 < *target)))) {
                  bVar1 = *target == '\r';
                }
                if (!bVar1) break;
                target = target + 1;
              }
              bVar1 = false;
              for (; *target != '\0'; target = target + 1) {
                if ((*target == ' ') || (((8 < *target && (*target < 0xb)) || (*target == '\r')))) {
                  bVar1 = true;
                }
                else {
                  if (bVar1) {
                    *pxStack_28 = ' ';
                    bVar1 = false;
                    pxStack_28 = pxStack_28 + 1;
                  }
                  *pxStack_28 = *target;
                  pxStack_28 = pxStack_28 + 1;
                }
              }
              *pxStack_28 = '\0';
            }
          }
        }
      }
      else {
        xmlXPathErr(ctxt,0xc);
      }
    }
  }
  return;
}

Assistant:

void
xmlXPathNormalizeFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlChar *source, *target;
    int blank;

    if (ctxt == NULL) return;
    if (nargs == 0) {
        /* Use current context node */
        source = xmlXPathCastNodeToString(ctxt->context->node);
        if (source == NULL)
            xmlXPathPErrMemory(ctxt);
        xmlXPathValuePush(ctxt, xmlXPathCacheWrapString(ctxt, source));
        nargs = 1;
    }

    CHECK_ARITY(1);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    source = ctxt->value->stringval;
    if (source == NULL)
        return;
    target = source;

    /* Skip leading whitespaces */
    while (IS_BLANK_CH(*source))
        source++;

    /* Collapse intermediate whitespaces, and skip trailing whitespaces */
    blank = 0;
    while (*source) {
        if (IS_BLANK_CH(*source)) {
	    blank = 1;
        } else {
            if (blank) {
                *target++ = 0x20;
                blank = 0;
            }
            *target++ = *source;
        }
        source++;
    }
    *target = 0;
}